

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTupleDrop
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,uint32_t arity)

{
  Drop *pDVar1;
  bool bVar2;
  Ok local_d5;
  uint local_d4;
  Err local_d0;
  Err *local_b0;
  Err *err;
  ChildPopper local_a0;
  undefined1 local_98 [8];
  Result<wasm::Ok> _val;
  Drop curr;
  allocator<char> local_41;
  Err local_40;
  uint32_t local_1c;
  IRBuilder *pIStack_18;
  uint32_t arity_local;
  IRBuilder *this_local;
  
  local_1c = arity;
  pIStack_18 = this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  if (arity < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"tuple arity must be at least 2",&local_41);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    pDVar1 = (Drop *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    Drop::Drop(pDVar1);
    ChildPopper::ChildPopper(&local_a0,this);
    std::optional<unsigned_int>::optional<unsigned_int_&,_true>
              ((optional<unsigned_int> *)&err,&local_1c);
    ChildPopper::visitDrop
              ((Result<wasm::Ok> *)local_98,&local_a0,pDVar1,(optional<unsigned_int>)err);
    local_b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_98);
    bVar2 = local_b0 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_d0,local_b0);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_d0);
      wasm::Err::~Err(&local_d0);
    }
    local_d4 = (uint)bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_98);
    if (local_d4 == 0) {
      pDVar1 = Builder::makeDrop(&this->builder,
                                 (Expression *)
                                 curr.super_SpecificExpression<(wasm::Expression::Id)18>.
                                 super_Expression.type.id);
      push(this,(Expression *)pDVar1);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTupleDrop(uint32_t arity) {
  if (arity < 2) {
    return Err{"tuple arity must be at least 2"};
  }
  Drop curr;
  CHECK_ERR(ChildPopper{*this}.visitDrop(&curr, arity));
  push(builder.makeDrop(curr.value));
  return Ok{};
}